

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_utf.h
# Opt level: O3

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
booster::locale::conv::utf_to_utf<wchar_t,wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,conv *this,wchar_t *begin,wchar_t *end,method_type how)

{
  conversion_error *this_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  do {
    if (this == (conv *)begin) {
      return __return_storage_ptr__;
    }
    if ((uint)*(wchar_t *)this < 0x110000 && (*(wchar_t *)this & 0x1ff800U) != 0xd800) {
      std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    }
    else if ((int)end == 1) {
      this_00 = (conversion_error *)__cxa_allocate_exception(0x30);
      conversion_error::conversion_error(this_00);
      __cxa_throw(this_00,&conversion_error::typeinfo,runtime_error::~runtime_error);
    }
    this = this + 4;
  } while( true );
}

Assistant:

std::basic_string<CharOut>
            utf_to_utf(CharIn const *begin,CharIn const *end,method_type how = default_method)
            {
                std::basic_string<CharOut> result;
                result.reserve(end-begin);
                typedef std::back_insert_iterator<std::basic_string<CharOut> > inserter_type;
                inserter_type inserter(result);
                utf::code_point c;
                while(begin!=end) {
                    c=utf::utf_traits<CharIn>::template decode<CharIn const *>(begin,end);
                    if(c==utf::illegal || c==utf::incomplete) {
                        if(how==stop)
                            throw conversion_error();
                    }
                    else {
                        utf::utf_traits<CharOut>::template encode<inserter_type>(c,inserter);
                    }
                }
                return result;
            }